

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O1

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>
          (uhugeint_t min_value,uhugeint_t max_value)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uhugeint_t local_40;
  uhugeint_t local_30;
  
  local_40.upper = max_value.upper;
  local_40.lower = max_value.lower;
  uhugeint_t::uhugeint_t(&local_30,0);
  bVar1 = uhugeint_t::operator==(&local_40,&local_30);
  bVar2 = 0;
  if (!bVar1) {
    bVar1 = uhugeint_t::operator_cast_to_bool(&local_40);
    bVar3 = 0;
    if (bVar1) {
      do {
        bVar3 = bVar3 + 1;
        uhugeint_t::uhugeint_t(&local_30,1);
        uhugeint_t::operator>>=(&local_40,&local_30);
        bVar1 = uhugeint_t::operator_cast_to_bool(&local_40);
      } while (bVar1);
    }
    bVar2 = 0x80;
    if (bVar3 < 0x71) {
      bVar2 = bVar3;
    }
  }
  return bVar2;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}